

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::SdfAnnotateTask::checkArguments
          (SdfAnnotateTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  size_type sVar2;
  Expression *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *in_RDI;
  ASTContext *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  size_t i;
  Compilation *comp;
  Type *pTVar3;
  ulong local_58;
  SystemSubroutine *in_stack_fffffffffffffff8;
  
  this_00 = ASTContext::getCompilation((ASTContext *)0xb5a0b9);
  pTVar3 = (Type *)0x7;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_fffffffffffffff8,in_R8,SUB81((ulong)in_RCX >> 0x38,0),in_RDI,
                     in_stack_00000000,in_stack_00000020,in_stack_00000028);
  if (bVar1) {
    for (local_58 = 0;
        sVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                          ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           0xb5a13b), local_58 < sVar2; local_58 = local_58 + 1) {
      if (local_58 != 1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0)
        ;
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0xb5a16a);
        bVar1 = Type::canBeStringLike(pTVar3);
        if (!bVar1) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    (in_RDX,local_58);
          pTVar3 = SystemSubroutine::badArg((SystemSubroutine *)this_00,in_R8,in_RCX);
          return pTVar3;
        }
      }
    }
    pTVar3 = Compilation::getVoidType(this_00);
  }
  else {
    pTVar3 = Compilation::getErrorType(this_00);
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 7))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            if (i != 1 && !args[0]->type->canBeStringLike())
                return badArg(context, *args[i]);
        }

        return comp.getVoidType();
    }